

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int socket_get(nng_socket s,char *name,void *val,size_t *szp,nni_type t)

{
  int iVar1;
  nni_sock *pnStack_38;
  int rv;
  nni_sock *sock;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *val_local;
  char *name_local;
  nng_socket s_local;
  
  sock._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)val;
  val_local = name;
  name_local._0_4_ = s.id;
  name_local._4_4_ = nni_sock_find(&stack0xffffffffffffffc8,s.id);
  if (name_local._4_4_ == 0) {
    iVar1 = nni_sock_getopt(pnStack_38,(char *)val_local,szp_local,psStack_28,sock._4_4_);
    nni_sock_rele(pnStack_38);
    name_local._4_4_ = iVar1;
  }
  return name_local._4_4_;
}

Assistant:

static int
socket_get(nng_socket s, const char *name, void *val, size_t *szp, nni_type t)
{
	nni_sock *sock;
	int       rv;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	rv = nni_sock_getopt(sock, name, val, szp, t);
	nni_sock_rele(sock);
	return (rv);
}